

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::VectorDCE::RewriteInsertInstruction
          (VectorDCE *this,Instruction *current_inst,BitVector *live_components,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *dead_dbg_value)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  uint32_t uVar2;
  uint32_t before;
  IRContext *pIVar3;
  uint32_t local_9c;
  iterator local_98;
  undefined8 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  uint32_t local_5c;
  undefined1 local_58 [4];
  uint32_t undef_id;
  BitVector temp;
  uint32_t composite_id;
  uint32_t insert_index;
  uint32_t object_id;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *dead_dbg_value_local;
  BitVector *live_components_local;
  Instruction *current_inst_local;
  VectorDCE *this_local;
  
  uVar2 = opt::Instruction::NumInOperands(current_inst);
  if (uVar2 == 2) {
    pIVar3 = Pass::context((Pass *)this);
    uVar2 = opt::Instruction::result_id(current_inst);
    IRContext::KillNamesAndDecorates(pIVar3,uVar2);
    uVar2 = opt::Instruction::GetSingleWordInOperand(current_inst,0);
    pIVar3 = Pass::context((Pass *)this);
    before = opt::Instruction::result_id(current_inst);
    IRContext::ReplaceAllUsesWith(pIVar3,before,uVar2);
    this_local._7_1_ = true;
  }
  else {
    uVar2 = opt::Instruction::GetSingleWordInOperand(current_inst,2);
    bVar1 = utils::BitVector::Get(live_components,uVar2);
    if (bVar1) {
      utils::BitVector::BitVector((BitVector *)local_58,live_components);
      utils::BitVector::Clear((BitVector *)local_58,uVar2);
      this_local._7_1_ = utils::BitVector::Empty((BitVector *)local_58);
      if (this_local._7_1_) {
        pIVar3 = Pass::context((Pass *)this);
        IRContext::ForgetUses(pIVar3,current_inst);
        uVar2 = opt::Instruction::type_id(current_inst);
        local_9c = MemPass::Type2Undef(&this->super_MemPass,uVar2);
        local_98 = &local_9c;
        local_90 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_98;
        local_5c = local_9c;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,init_list);
        opt::Instruction::SetInOperand(current_inst,1,&local_88);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88);
        pIVar3 = Pass::context((Pass *)this);
        IRContext::AnalyzeUses(pIVar3,current_inst);
      }
      utils::BitVector::~BitVector((BitVector *)local_58);
    }
    else {
      MarkDebugValueUsesAsDead(this,current_inst,dead_dbg_value);
      pIVar3 = Pass::context((Pass *)this);
      uVar2 = opt::Instruction::result_id(current_inst);
      IRContext::KillNamesAndDecorates(pIVar3,uVar2);
      temp.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           opt::Instruction::GetSingleWordInOperand(current_inst,1);
      pIVar3 = Pass::context((Pass *)this);
      uVar2 = opt::Instruction::result_id(current_inst);
      IRContext::ReplaceAllUsesWith
                (pIVar3,uVar2,
                 temp.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool VectorDCE::RewriteInsertInstruction(
    Instruction* current_inst, const utils::BitVector& live_components,
    std::vector<Instruction*>* dead_dbg_value) {
  // If the value being inserted is not live, then we can skip the insert.

  if (current_inst->NumInOperands() == 2) {
    // If there are no indices, then this is the same as a copy.
    context()->KillNamesAndDecorates(current_inst->result_id());
    uint32_t object_id =
        current_inst->GetSingleWordInOperand(kInsertObjectIdInIdx);
    context()->ReplaceAllUsesWith(current_inst->result_id(), object_id);
    return true;
  }

  uint32_t insert_index = current_inst->GetSingleWordInOperand(2);
  if (!live_components.Get(insert_index)) {
    MarkDebugValueUsesAsDead(current_inst, dead_dbg_value);
    context()->KillNamesAndDecorates(current_inst->result_id());
    uint32_t composite_id =
        current_inst->GetSingleWordInOperand(kInsertCompositeIdInIdx);
    context()->ReplaceAllUsesWith(current_inst->result_id(), composite_id);
    return true;
  }

  // If the values already in the composite are not used, then replace it with
  // an undef.
  utils::BitVector temp = live_components;
  temp.Clear(insert_index);
  if (temp.Empty()) {
    context()->ForgetUses(current_inst);
    uint32_t undef_id = Type2Undef(current_inst->type_id());
    current_inst->SetInOperand(kInsertCompositeIdInIdx, {undef_id});
    context()->AnalyzeUses(current_inst);
    return true;
  }

  return false;
}